

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::batch_normalize_gradient
               (double eps,tensor *gradient_input,tensor *means,tensor *invstds,tensor *src,
               tensor *gamma,tensor *src_grad,tensor *gamma_grad,tensor *beta_grad)

{
  float fVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  undefined8 uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  tensor *in_RCX;
  tensor *in_RDX;
  tensor *in_RSI;
  long *in_RDI;
  tensor *in_R8;
  long *in_R9;
  float fVar19;
  double in_XMM0_Qa;
  double dVar20;
  tensor *in_stack_00000008;
  tensor *in_stack_00000010;
  float dx_2;
  long i_2;
  long n_2;
  float *p_src_grad;
  float dx_1;
  long i_1;
  long n_1;
  float invnum;
  float dx;
  float x_hat;
  long i;
  long n;
  float *p_dmeans;
  float *p_dvars;
  resizable_tensor dmeans;
  resizable_tensor dvars;
  float *p_means;
  float *p_invstds;
  float *p_beta_grad;
  float *p_gamma_grad;
  float *p_gamma;
  float *p_src;
  float *p_grad;
  ostringstream dlib_o_out_8;
  ostringstream dlib_o_out_7;
  ostringstream dlib_o_out_6;
  ostringstream dlib_o_out_5;
  ostringstream dlib_o_out_4;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  long num;
  float in_stack_ffffffffffffeb4c;
  resizable_tensor *in_stack_ffffffffffffeb50;
  resizable_tensor *this;
  resizable_tensor *in_stack_ffffffffffffeb60;
  tensor *in_stack_ffffffffffffeb68;
  error_type eVar21;
  resizable_tensor *in_stack_ffffffffffffeb70;
  long local_1088;
  resizable_tensor *local_1080;
  float *local_1078;
  long local_1068;
  long local_1060;
  long local_1048;
  long local_1040;
  float *local_f00;
  float *local_ef8;
  ostream local_ec8;
  undefined1 local_d49;
  ostream local_d28;
  undefined1 local_ba9;
  ostream local_b88;
  undefined1 local_a09;
  ostream local_9e8;
  undefined1 local_869;
  ostream local_848;
  undefined1 local_6c9;
  ostream local_6a8;
  undefined1 local_529;
  ostream local_508;
  undefined1 local_389;
  ostream local_368;
  undefined1 local_1e9;
  ostream local_1b8;
  size_t local_40;
  long *local_38;
  tensor *local_30;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  long *local_10;
  double local_8;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_XMM0_Qa;
  lVar9 = tensor::k(in_RCX);
  lVar10 = tensor::nr(local_28);
  lVar11 = tensor::nc(local_28);
  local_40 = lVar9 * lVar10 * lVar11;
  lVar9 = tensor::num_samples(local_28);
  sVar4 = local_40;
  if (lVar9 < 2) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    poVar12 = std::operator<<(&local_1b8,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x339);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_1b8,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_1b8,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_1b8,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"src.num_samples() > 1");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_1b8,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_1e9 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_1e9 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar14 = tensor::size(local_18);
  sVar15 = local_40;
  if (sVar4 != sVar14) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_368);
    poVar12 = std::operator<<(&local_368,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33a);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_368,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_368,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_368,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)means.size()");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_368,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_389 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_389 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar14 = tensor::size(local_20);
  sVar4 = local_40;
  if (sVar15 != sVar14) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_508);
    poVar12 = std::operator<<(&local_508,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33b);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_508,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_508,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_508,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)invstds.size()");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_508,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_529 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_529 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar14 = tensor::size(local_30);
  sVar15 = local_40;
  if (sVar4 != sVar14) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6a8);
    poVar12 = std::operator<<(&local_6a8,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33c);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_6a8,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_6a8,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_6a8,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)gamma.size()");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_6a8,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_6c9 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_6c9 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar14 = tensor::size(in_stack_00000008);
  sVar4 = local_40;
  if (sVar15 != sVar14) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_848);
    poVar12 = std::operator<<(&local_848,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33d);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_848,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_848,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_848,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)gamma_grad.size()");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_848,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_869 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_869 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar15 = tensor::size(in_stack_00000010);
  if (sVar4 != sVar15) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_9e8);
    poVar12 = std::operator<<(&local_9e8,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33e);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_9e8,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_9e8,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_9e8,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"num == (long)beta_grad.size()");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_9e8,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_a09 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_a09 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar5 = have_same_dimensions(&in_stack_ffffffffffffeb70->super_tensor,in_stack_ffffffffffffeb68);
  if (!bVar5) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_b88);
    poVar12 = std::operator<<(&local_b88,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x33f);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_b88,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_b88,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_b88,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"have_same_dimensions(gradient_input, src)");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_b88,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_ba9 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_ba9 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar5 = have_same_dimensions(&in_stack_ffffffffffffeb70->super_tensor,in_stack_ffffffffffffeb68);
  if (!bVar5) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_d28);
    poVar12 = std::operator<<(&local_d28,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x340);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_d28,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_d28,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_d28,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"have_same_dimensions(gradient_input, src_grad)");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_d28,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    local_d49 = 1;
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    local_d49 = 0;
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (local_8 <= 0.0) {
    dlib_assert_breakpoint();
    eVar21 = (error_type)((ulong)in_stack_ffffffffffffeb68 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_ec8);
    poVar12 = std::operator<<(&local_ec8,"\n\nError detected at line ");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x341);
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_ec8,"Error detected in file ");
    poVar12 = std::operator<<(poVar12,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar12,".\n");
    poVar12 = std::operator<<(&local_ec8,"Error detected in function ");
    poVar12 = std::operator<<(poVar12,
                              "void dlib::cpu::batch_normalize_gradient(const double, const tensor &, const tensor &, const tensor &, const tensor &, const tensor &, tensor &, tensor &, tensor &)"
                             );
    std::operator<<(poVar12,".\n\n");
    poVar12 = std::operator<<(&local_ec8,"Failing expression was ");
    poVar12 = std::operator<<(poVar12,"eps > 0");
    std::operator<<(poVar12,".\n");
    poVar12 = (ostream *)std::ostream::operator<<(&local_ec8,std::boolalpha);
    poVar12 = std::operator<<(poVar12,"");
    std::operator<<(poVar12,"\n");
    uVar13 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_ffffffffffffeb70,eVar21,(string *)in_stack_ffffffffffffeb60);
    __cxa_throw(uVar13,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  tensor::operator=(&in_stack_ffffffffffffeb70->super_tensor,
                    (float)((ulong)in_stack_ffffffffffffeb68 >> 0x20));
  tensor::operator=(&in_stack_ffffffffffffeb70->super_tensor,
                    (float)((ulong)in_stack_ffffffffffffeb68 >> 0x20));
  local_ef8 = (float *)(**(code **)(*local_10 + 0x10))();
  iVar6 = (*local_28->_vptr_tensor[2])();
  local_f00 = (float *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*local_30->_vptr_tensor[2])();
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  iVar6 = (*in_stack_00000008->_vptr_tensor[3])();
  iVar7 = (*in_stack_00000010->_vptr_tensor[3])();
  iVar8 = (*local_20->_vptr_tensor[2])();
  lVar10 = CONCAT44(extraout_var_03,iVar8);
  iVar8 = (*local_18->_vptr_tensor[2])();
  lVar11 = CONCAT44(extraout_var_04,iVar8);
  resizable_tensor::resizable_tensor(in_stack_ffffffffffffeb60);
  resizable_tensor::resizable_tensor(in_stack_ffffffffffffeb60);
  resizable_tensor::copy_size(in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68);
  resizable_tensor::copy_size(in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68);
  resizable_tensor::operator=(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  resizable_tensor::operator=(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb4c);
  pfVar16 = resizable_tensor::host((resizable_tensor *)0x375e8b);
  pfVar17 = resizable_tensor::host((resizable_tensor *)0x375eb2);
  local_1040 = 0;
  while( true ) {
    lVar18 = tensor::num_samples(local_28);
    if (lVar18 <= local_1040) break;
    for (local_1048 = 0; local_1048 < (long)local_40; local_1048 = local_1048 + 1) {
      fVar19 = *local_f00;
      fVar1 = *(float *)(lVar11 + local_1048 * 4);
      fVar2 = *(float *)(lVar10 + local_1048 * 4);
      *(float *)(CONCAT44(extraout_var_02,iVar7) + local_1048 * 4) =
           *(float *)(CONCAT44(extraout_var_02,iVar7) + local_1048 * 4) + *local_ef8;
      *(float *)(CONCAT44(extraout_var_01,iVar6) + local_1048 * 4) =
           *local_ef8 * (fVar19 - fVar1) * fVar2 +
           *(float *)(CONCAT44(extraout_var_01,iVar6) + local_1048 * 4);
      fVar19 = *local_ef8;
      fVar1 = *(float *)(lVar9 + local_1048 * 4);
      fVar2 = *local_f00;
      fVar3 = *(float *)(lVar11 + local_1048 * 4);
      dVar20 = std::pow((double)(ulong)*(uint *)(lVar10 + local_1048 * 4),5.32571209255933e-315);
      pfVar16[local_1048] =
           fVar19 * fVar1 * (fVar2 - fVar3) * -0.5 * SUB84(dVar20,0) + pfVar16[local_1048];
      local_ef8 = local_ef8 + 1;
      local_f00 = local_f00 + 1;
    }
    local_1040 = local_1040 + 1;
  }
  lVar18 = tensor::num_samples(local_28);
  fVar19 = 1.0 / (float)lVar18;
  local_ef8 = (float *)(**(code **)(*local_10 + 0x10))();
  iVar6 = (*local_28->_vptr_tensor[2])();
  local_f00 = (float *)CONCAT44(extraout_var_05,iVar6);
  local_1060 = 0;
  while( true ) {
    lVar18 = tensor::num_samples(local_28);
    if (lVar18 <= local_1060) break;
    for (local_1068 = 0; local_1068 < (long)local_40; local_1068 = local_1068 + 1) {
      pfVar17[local_1068] =
           *local_ef8 * *(float *)(lVar9 + local_1068 * 4) * -*(float *)(lVar10 + local_1068 * 4) +
           pfVar16[local_1068] * -2.0 * (*local_f00 - *(float *)(lVar11 + local_1068 * 4)) * fVar19
           + pfVar17[local_1068];
      local_ef8 = local_ef8 + 1;
      local_f00 = local_f00 + 1;
    }
    local_1060 = local_1060 + 1;
  }
  local_ef8 = (float *)(**(code **)(*local_10 + 0x10))();
  iVar6 = (*local_28->_vptr_tensor[2])();
  local_f00 = (float *)CONCAT44(extraout_var_06,iVar6);
  local_1078 = (float *)(**(code **)(*local_38 + 0x18))();
  local_1080 = (resizable_tensor *)0x0;
  while( true ) {
    this = local_1080;
    lVar18 = tensor::num_samples(local_28);
    if (lVar18 <= (long)this) break;
    for (local_1088 = 0; local_1088 < (long)local_40; local_1088 = local_1088 + 1) {
      *local_1078 = pfVar17[local_1088] * fVar19 +
                    *local_ef8 * *(float *)(lVar9 + local_1088 * 4) *
                    *(float *)(lVar10 + local_1088 * 4) +
                    pfVar16[local_1088] * 2.0 * (*local_f00 - *(float *)(lVar11 + local_1088 * 4)) *
                    fVar19 + *local_1078;
      local_ef8 = local_ef8 + 1;
      local_f00 = local_f00 + 1;
      local_1078 = local_1078 + 1;
    }
    local_1080 = (resizable_tensor *)((long)&(local_1080->super_tensor)._vptr_tensor + 1);
  }
  resizable_tensor::~resizable_tensor(this);
  resizable_tensor::~resizable_tensor(this);
  return;
}

Assistant:

void batch_normalize_gradient (
            const double eps,
            const tensor& gradient_input,
            const tensor& means,
            const tensor& invstds,
            const tensor& src,
            const tensor& gamma,
            tensor& src_grad,
            tensor& gamma_grad, 
            tensor& beta_grad 
        )
        {

            const long num = src.k()*src.nr()*src.nc();
            DLIB_CASSERT(src.num_samples() > 1);
            DLIB_CASSERT(num == (long)means.size());
            DLIB_CASSERT(num == (long)invstds.size());
            DLIB_CASSERT(num == (long)gamma.size());
            DLIB_CASSERT(num == (long)gamma_grad.size());
            DLIB_CASSERT(num == (long)beta_grad.size());
            DLIB_CASSERT(have_same_dimensions(gradient_input, src));
            DLIB_CASSERT(have_same_dimensions(gradient_input, src_grad));
            DLIB_CASSERT(eps > 0);

            beta_grad = 0;
            gamma_grad = 0;
            auto p_grad = gradient_input.host();
            auto p_src = src.host();
            const auto p_gamma = gamma.host();   
            const auto p_gamma_grad = gamma_grad.host();   
            const auto p_beta_grad = beta_grad.host();   
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();

            resizable_tensor dvars, dmeans;
            dvars.copy_size(invstds);
            dmeans.copy_size(means);
            dvars = 0;
            dmeans = 0;
            const auto p_dvars = dvars.host();
            const auto p_dmeans = dmeans.host();

            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float x_hat = (*p_src - p_means[i])*p_invstds[i];
                    p_beta_grad[i] += *p_grad;
                    p_gamma_grad[i] += (*p_grad)*x_hat;

                    const float dx = *p_grad * p_gamma[i];

                    p_dvars[i] += dx*(*p_src - p_means[i])*-0.5*std::pow(p_invstds[i], 3.0f);

                    ++p_grad;
                    ++p_src;
                }
            }

            const float invnum = 1.0f/src.num_samples();
            p_grad = gradient_input.host();
            p_src = src.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float dx = *p_grad * p_gamma[i];

                    p_dmeans[i] += dx*-p_invstds[i] + p_dvars[i] * -2*(*p_src - p_means[i])*invnum;

                    ++p_grad;
                    ++p_src;
                }
            }
            p_grad = gradient_input.host();
            p_src = src.host();
            auto p_src_grad = src_grad.host();
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    const float dx = *p_grad * p_gamma[i];

                    *p_src_grad += dx*p_invstds[i] + 
                        p_dvars[i] *2*(*p_src - p_means[i])*invnum + 
                        p_dmeans[i]*invnum;


                    ++p_grad;
                    ++p_src;
                    ++p_src_grad;
                }
            }
        }